

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O2

bool DecodeHexBlockHeader(CBlockHeader *header,string *hex_header)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view str;
  string_view hex_str;
  Span<const_std::byte> sp;
  DataStream ser_header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_data;
  DataStream DStack_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (hex_header->_M_dataplus)._M_p;
  str._M_len = hex_header->_M_string_length;
  bVar1 = IsHex(str);
  if (bVar1) {
    hex_str._M_str = (hex_header->_M_dataplus)._M_p;
    hex_str._M_len = hex_header->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,hex_str);
    sp.m_size = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38._M_impl.super__Vector_impl_data._M_start;
    sp.m_data = local_38._M_impl.super__Vector_impl_data._M_start;
    DataStream::DataStream(&DStack_58,sp);
    CBlockHeader::SerializationOps<DataStream,CBlockHeader,ActionUnserialize>(header,&DStack_58);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_58);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool DecodeHexBlockHeader(CBlockHeader& header, const std::string& hex_header)
{
    if (!IsHex(hex_header)) return false;

    const std::vector<unsigned char> header_data{ParseHex(hex_header)};
    DataStream ser_header{header_data};
    try {
        ser_header >> header;
    } catch (const std::exception&) {
        return false;
    }
    return true;
}